

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.cpp
# Opt level: O2

bool duckdb::StringUtil::CILessThan(string *s1,string *s2)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  idx_t i;
  long lVar6;
  byte bVar7;
  byte bVar8;
  
  uVar1 = s1->_M_string_length;
  uVar2 = s2->_M_string_length;
  uVar3 = uVar2;
  if (uVar1 < uVar2) {
    uVar3 = uVar1;
  }
  uVar4 = 0;
  uVar5 = 0;
  lVar6 = 0;
  do {
    if ((uVar1 != uVar2) + uVar3 == lVar6) {
      bVar7 = ASCII_TO_UPPER_MAP[uVar4];
      bVar8 = ASCII_TO_UPPER_MAP[uVar5];
      break;
    }
    uVar4 = (ulong)(byte)(s1->_M_dataplus)._M_p[lVar6];
    uVar5 = (ulong)(byte)(s2->_M_dataplus)._M_p[lVar6];
    bVar7 = ASCII_TO_UPPER_MAP[uVar4];
    bVar8 = ASCII_TO_UPPER_MAP[uVar5];
    lVar6 = lVar6 + 1;
  } while (bVar7 == bVar8);
  return bVar7 < bVar8;
}

Assistant:

bool StringUtil::CILessThan(const string &s1, const string &s2) {
	const auto charmap = ASCII_TO_UPPER_MAP;

	unsigned char u1 {}, u2 {};

	idx_t length = MinValue<idx_t>(s1.length(), s2.length());
	length += s1.length() != s2.length();
	for (idx_t i = 0; i < length; i++) {
		u1 = (unsigned char)s1[i];
		u2 = (unsigned char)s2[i];
		if (charmap[u1] != charmap[u2]) {
			break;
		}
	}
	return (charmap[u1] - charmap[u2]) < 0;
}